

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello.c
# Opt level: O2

int main(void)

{
  int iVar1;
  long lVar2;
  uchar digest [16];
  char str [14];
  
  builtin_strncpy(str + 8,"orld!",6);
  builtin_strncpy(str,"Hello, w",8);
  printf("\n  MD5(\'%s\') = ",str);
  iVar1 = mbedtls_md5_ret((uchar *)str,0xd,digest);
  if (iVar1 == 0) {
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
      printf("%02x",(ulong)digest[lVar2]);
    }
    puts("\n");
    iVar1 = 0;
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int main( void )
{
    int i, ret;
    unsigned char digest[16];
    char str[] = "Hello, world!";

    mbedtls_printf( "\n  MD5('%s') = ", str );

    if( ( ret = mbedtls_md5_ret( (unsigned char *) str, 13, digest ) ) != 0 )
        return( MBEDTLS_EXIT_FAILURE );

    for( i = 0; i < 16; i++ )
        mbedtls_printf( "%02x", digest[i] );

    mbedtls_printf( "\n\n" );

#if defined(_WIN32)
    mbedtls_printf( "  Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( MBEDTLS_EXIT_SUCCESS );
}